

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O0

int udp_listener(void)

{
  int iVar1;
  undefined4 local_30;
  int r;
  int namelen;
  sockaddr sockname;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,sockname.sa_data + 6);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getsockname.c"
            ,0x115,"0 == uv_ip4_addr(\"0.0.0.0\", server_port, &addr)");
    abort();
  }
  iVar1 = uv_udp_init(loop,&udpServer);
  if (iVar1 == 0) {
    iVar1 = uv_udp_bind(&udpServer,sockname.sa_data + 6,0);
    if (iVar1 == 0) {
      memset(&r,0xff,0x10);
      local_30 = 0x10;
      iVar1 = uv_udp_getsockname(&udpServer,&r,&local_30);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getsockname.c"
                ,0x126,"r == 0");
        abort();
      }
      check_sockname((sockaddr *)&r,"0.0.0.0",0x23a3,"udp listener socket");
      getsocknamecount = getsocknamecount + 1;
      iVar1 = uv_udp_recv_start(&udpServer,alloc,udp_recv);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getsockname.c"
                ,299,"r == 0");
        abort();
      }
      addr.sin_zero[0] = '\0';
      addr.sin_zero[1] = '\0';
      addr.sin_zero[2] = '\0';
      addr.sin_zero[3] = '\0';
    }
    else {
      fprintf(_stderr,"Bind error\n");
      addr.sin_zero[0] = '\x01';
      addr.sin_zero[1] = '\0';
      addr.sin_zero[2] = '\0';
      addr.sin_zero[3] = '\0';
    }
  }
  else {
    fprintf(_stderr,"Socket creation error\n");
    addr.sin_zero[0] = '\x01';
    addr.sin_zero[1] = '\0';
    addr.sin_zero[2] = '\0';
    addr.sin_zero[3] = '\0';
  }
  iVar1._0_1_ = addr.sin_zero[0];
  iVar1._1_1_ = addr.sin_zero[1];
  iVar1._2_1_ = addr.sin_zero[2];
  iVar1._3_1_ = addr.sin_zero[3];
  return iVar1;
}

Assistant:

static int udp_listener(void) {
  struct sockaddr_in addr;
  struct sockaddr sockname;
  int namelen;
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", server_port, &addr));

  r = uv_udp_init(loop, &udpServer);
  if (r) {
    fprintf(stderr, "Socket creation error\n");
    return 1;
  }

  r = uv_udp_bind(&udpServer, (const struct sockaddr*) &addr, 0);
  if (r) {
    fprintf(stderr, "Bind error\n");
    return 1;
  }

  memset(&sockname, -1, sizeof sockname);
  namelen = sizeof sockname;
  r = uv_udp_getsockname(&udpServer, &sockname, &namelen);
  ASSERT(r == 0);
  check_sockname(&sockname, "0.0.0.0", server_port, "udp listener socket");
  getsocknamecount++;

  r = uv_udp_recv_start(&udpServer, alloc, udp_recv);
  ASSERT(r == 0);

  return 0;
}